

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

bool __thiscall Board::operator==(Board *this,Board *board)

{
  int iVar1;
  __type _Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  for (lVar3 = 0; iVar1 = board->row, lVar3 < iVar1; lVar3 = lVar3 + 1) {
    lVar5 = -1;
    lVar4 = 0;
    while (lVar5 = lVar5 + 1, lVar5 < board->column) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)&(this->matrix).
                                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data + lVar4),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (lVar4 + *(long *)&(board->matrix).
                                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data));
      lVar4 = lVar4 + 0x20;
      if (_Var2) goto LAB_001037ef;
    }
  }
LAB_001037ef:
  return lVar3 < iVar1;
}

Assistant:

bool operator==( Board board )
        {
            for( int i = 0; i < board.row; i++ )
            {
                for( int j = 0; j < board.column; j++ )
                {
                    if( this->matrix[i][j] == board.matrix[i][j] )
                    {
                        return true;
                    }
                }
            }

            return false;
        }